

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::StringToNumber<unsigned_short>(char *s,unsigned_short *val)

{
  bool bVar1;
  ulong in_RAX;
  unsigned_short uVar2;
  int64_t i64;
  ulong local_18;
  ulong uVar3;
  
  if ((s != (char *)0x0) && (val != (unsigned_short *)0x0)) {
    uVar2 = 0;
    local_18 = in_RAX;
    bVar1 = StringToIntegerImpl<long>((long *)&local_18,s,0,false);
    if (bVar1) {
      bVar1 = local_18 < 0x10000;
      uVar3 = 0xffff;
      if (local_18 < 0xffff) {
        uVar3 = local_18;
      }
      uVar2 = (unsigned_short)uVar3;
    }
    else {
      bVar1 = false;
    }
    *val = uVar2;
    return bVar1;
  }
  __assert_fail("s && val",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                ,0x14b,"bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]");
}

Assistant:

inline bool StringToNumber(const char *s, T *val) {
  // Assert on `unsigned long` and `signed long` on LP64.
  // If it is necessary, it could be solved with flatbuffers::enable_if<B,T>.
  static_assert(sizeof(T) < sizeof(int64_t), "unexpected type T");
  FLATBUFFERS_ASSERT(s && val);
  int64_t i64;
  // The errno check isn't needed, will return MAX/MIN on overflow.
  if (StringToIntegerImpl(&i64, s, 0, false)) {
    const int64_t max = (flatbuffers::numeric_limits<T>::max)();
    const int64_t min = flatbuffers::numeric_limits<T>::lowest();
    if (i64 > max) {
      *val = static_cast<T>(max);
      return false;
    }
    if (i64 < min) {
      // For unsigned types return max to distinguish from
      // "no conversion can be performed" when 0 is returned.
      *val = static_cast<T>(flatbuffers::is_unsigned<T>::value ? max : min);
      return false;
    }
    *val = static_cast<T>(i64);
    return true;
  }
  *val = 0;
  return false;
}